

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::UnknownFieldSet>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadata *metadata,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  EnumValidityFuncWithArg *pEVar2;
  uint32_t *data;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<const_char_*,_unsigned_long> pVar6;
  bool bVar7;
  int i;
  string *s;
  void *pvVar9;
  char *pcVar10;
  MessageLite *pMVar11;
  long lVar12;
  uint uVar8;
  ulong uVar13;
  undefined7 in_register_00000011;
  FieldType FVar14;
  UnknownFieldSet *this_00;
  FieldDescriptor *pFVar15;
  int value;
  unsigned_long uVar16;
  pair<const_char_*,_int> pVar17;
  pair<const_char_*,_unsigned_long> pVar18;
  pair<const_char_*,_unsigned_long> pVar19;
  pair<const_char_*,_unsigned_long> pVar20;
  pair<const_char_*,_unsigned_long> pVar21;
  pair<const_char_*,_unsigned_long> pVar22;
  pair<const_char_*,_unsigned_long> pVar23;
  void *local_58;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Stack_50;
  void *pvStack_48;
  InternalMetadata *pIStack_40;
  int local_38;
  undefined1 auVar3 [12];
  
  bVar1 = extension->type;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(bVar1) {
    case 1:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedDoubleParser(pvVar9,ptr,ctx);
      return pcVar10;
    case 2:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedFloatParser(pvVar9,ptr,ctx);
      return pcVar10;
    case 3:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedInt64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 4:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedUInt64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 5:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedInt32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 6:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedFixed64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 7:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedFixed32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 8:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedBoolParser(pvVar9,ptr,ctx);
      return pcVar10;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x37);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_58,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    case 0xd:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedUInt32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0xe:
      local_58 = MutableRawRepeatedField
                           (this,number,bVar1,extension->is_packed,extension->descriptor);
      _Stack_50._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )(extension->field_6).enum_validity_check.func;
      pvStack_48 = (extension->field_6).enum_validity_check.arg;
      pIStack_40 = metadata;
      local_38 = number;
      pcVar10 = EpsCopyInputStream::
                ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                          (&ctx->super_EpsCopyInputStream,ptr);
      return pcVar10;
    case 0xf:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedSFixed32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0x10:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedSFixed64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0x11:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedSInt32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0x12:
      pvVar9 = MutableRawRepeatedField(this,number,bVar1,extension->is_packed,extension->descriptor)
      ;
      pcVar10 = PackedSInt64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    default:
      return ptr;
    }
  }
  switch(bVar1 - 1) {
  case 0:
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,*(double *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetDouble(this,number,'\x01',*(double *)ptr,extension->descriptor);
    return ptr + 8;
  case 1:
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,*(float *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetFloat(this,number,'\x02',*(float *)ptr,extension->descriptor);
    return ptr + 4;
  case 2:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar19 = VarintParseSlow64(ptr,(uint)bVar1);
    }
    else {
      pVar19.second = (long)(char)bVar1;
      pVar19.first = ptr + 1;
    }
    if (pVar19.first != (char *)0x0) {
      if (extension->is_repeated == true) {
        bVar7 = extension->is_packed;
        pFVar15 = extension->descriptor;
        FVar14 = '\x03';
        goto LAB_0032724b;
      }
      pFVar15 = extension->descriptor;
      FVar14 = '\x03';
LAB_0032733e:
      pcVar10 = pVar19.first;
      SetInt64(this,number,FVar14,pVar19.second,pFVar15);
LAB_003273e6:
      if (pcVar10 != (char *)0x0) {
        return pcVar10;
      }
    }
    break;
  case 3:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar20 = VarintParseSlow64(ptr,(uint)bVar1);
    }
    else {
      pVar20.second = (long)(char)bVar1;
      pVar20.first = ptr + 1;
    }
    pcVar10 = pVar20.first;
    if (pcVar10 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddUInt64(this,number,'\x04',extension->is_packed,pVar20.second,extension->descriptor);
      }
      else {
        SetUInt64(this,number,'\x04',pVar20.second,extension->descriptor);
      }
      goto LAB_003273e6;
    }
    break;
  case 4:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar22 = VarintParseSlow64(ptr,(uint)bVar1);
      auVar3 = pVar22._0_12_;
    }
    else {
      auVar5._8_8_ = (long)(char)bVar1;
      auVar5._0_8_ = ptr + 1;
      auVar3 = auVar5._0_12_;
    }
    pcVar10 = auVar3._0_8_;
    uVar8 = auVar3._8_4_;
    if (pcVar10 != (char *)0x0) {
      if (extension->is_repeated == true) {
        bVar7 = extension->is_packed;
        pFVar15 = extension->descriptor;
        FVar14 = '\x05';
        goto LAB_0032711c;
      }
      pFVar15 = extension->descriptor;
      FVar14 = '\x05';
LAB_003272d1:
      SetInt32(this,number,FVar14,uVar8,pFVar15);
      goto LAB_003273e6;
    }
    break;
  case 5:
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x06',extension->is_packed,*(uint64_t *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetUInt64(this,number,'\x06',*(uint64_t *)ptr,extension->descriptor);
    return ptr + 8;
  case 6:
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\a',extension->is_packed,*(uint32_t *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetUInt32(this,number,'\a',*(uint32_t *)ptr,extension->descriptor);
    return ptr + 4;
  case 7:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar21 = VarintParseSlow64(ptr,(uint)bVar1);
    }
    else {
      pVar21.second = (long)(char)bVar1;
      pVar21.first = ptr + 1;
    }
    pcVar10 = pVar21.first;
    if (pcVar10 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddBool(this,number,'\b',extension->is_packed,pVar21.second != 0,extension->descriptor);
      }
      else {
        SetBool(this,number,'\b',pVar21.second != 0,extension->descriptor);
      }
      goto LAB_003273e6;
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar1 = *ptr;
    uVar8 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar17 = ReadSizeFallback(ptr,(uint)bVar1);
      uVar8 = pVar17.second;
      pcVar10 = pVar17.first;
    }
    else {
      pcVar10 = ptr + 1;
    }
    if (pcVar10 != (char *)0x0) {
      pcVar10 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar10,uVar8,s);
      return pcVar10;
    }
    break;
  case 9:
    pMVar11 = (extension->field_6).message_info.prototype;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    pcVar10 = ParseContext::ParseGroup(ctx,pMVar11,ptr,number * 8 + 3);
    return pcVar10;
  case 10:
    pMVar11 = (extension->field_6).message_info.prototype;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    pcVar10 = ParseContext::ParseMessage(ctx,pMVar11,ptr);
    return pcVar10;
  case 0xc:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar22 = VarintParseSlow64(ptr,(uint)bVar1);
      auVar3 = pVar22._0_12_;
    }
    else {
      auVar4._8_8_ = (long)(char)bVar1;
      auVar4._0_8_ = ptr + 1;
      auVar3 = auVar4._0_12_;
    }
    pcVar10 = auVar3._0_8_;
    if (pcVar10 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddUInt32(this,number,'\r',extension->is_packed,auVar3._8_4_,extension->descriptor);
      }
      else {
        SetUInt32(this,number,'\r',auVar3._8_4_,extension->descriptor);
      }
      goto LAB_003273e6;
    }
    break;
  case 0xd:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    uVar16 = (unsigned_long)*ptr;
    if ((long)uVar16 < 0) {
      pVar23 = VarintParseSlow64(ptr,(uint)(byte)*ptr);
      uVar16 = pVar23.second;
    }
    else {
      pVar23.second._0_4_ = bVar1 - 1;
      pVar23.first = ptr + 1;
      pVar23.second._4_4_ = 0;
    }
    pcVar10 = pVar23.first;
    if (pcVar10 != (char *)0x0) {
      pEVar2 = (extension->field_6).enum_validity_check.func;
      data = (uint32_t *)(extension->field_6).enum_validity_check.arg;
      value = (int)uVar16;
      if (pEVar2 == (EnumValidityFuncWithArg *)0x0) {
        bVar7 = ValidateEnum(value,data);
      }
      else {
        bVar7 = (*pEVar2)(data,value);
      }
      if (bVar7 == false) {
        if ((metadata->ptr_ & 1U) == 0) {
          this_00 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                              (metadata);
        }
        else {
          this_00 = (UnknownFieldSet *)((metadata->ptr_ & 0xfffffffffffffffeU) + 8);
        }
        UnknownFieldSet::AddVarint(this_00,number,(long)value);
      }
      else if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,value,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',value,extension->descriptor);
      }
      goto LAB_003273e6;
    }
    break;
  case 0xe:
    if (extension->is_repeated == true) {
      AddInt32(this,number,'\x0f',extension->is_packed,*(int32_t *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetInt32(this,number,'\x0f',*(int32_t *)ptr,extension->descriptor);
    return ptr + 4;
  case 0xf:
    if (extension->is_repeated == true) {
      AddInt64(this,number,'\x10',extension->is_packed,*(int64_t *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetInt64(this,number,'\x10',*(int64_t *)ptr,extension->descriptor);
    return ptr + 8;
  case 0x10:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar18 = VarintParseSlow64(ptr,(uint)bVar1);
    }
    else {
      pVar18.second = (long)(char)bVar1;
      pVar18.first = ptr + 1;
    }
    pcVar10 = pVar18.first;
    if (pcVar10 != (char *)0x0) {
      uVar8 = -((uint)pVar18.second & 1) ^ (uint)(pVar18.second >> 1) & 0x7fffffff;
      if (extension->is_repeated != true) {
        pFVar15 = extension->descriptor;
        FVar14 = '\x11';
        goto LAB_003272d1;
      }
      bVar7 = extension->is_packed;
      pFVar15 = extension->descriptor;
      FVar14 = '\x11';
LAB_0032711c:
      AddInt32(this,number,FVar14,bVar7,uVar8,pFVar15);
      goto LAB_003273e6;
    }
    break;
  case 0x11:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar22 = VarintParseSlow64(ptr,(uint)bVar1);
    }
    else {
      pVar22.second = (long)(char)bVar1;
      pVar22.first = ptr + 1;
    }
    pcVar10 = pVar22.first;
    if (pcVar10 != (char *)0x0) {
      uVar13 = -(ulong)((uint)pVar22.second & 1) ^ pVar22.second >> 1;
      pVar6.second = uVar13;
      pVar6.first = pcVar10;
      pVar19.second = uVar13;
      pVar19.first = pcVar10;
      if (extension->is_repeated != true) {
        pFVar15 = extension->descriptor;
        FVar14 = '\x12';
        goto LAB_0032733e;
      }
      bVar7 = extension->is_packed;
      pFVar15 = extension->descriptor;
      FVar14 = '\x12';
      pVar19 = pVar6;
LAB_0032724b:
      pcVar10 = pVar19.first;
      AddInt64(this,number,FVar14,bVar7,pVar19.second,pFVar15);
      goto LAB_003273e6;
    }
    break;
  default:
    goto switchD_00326917_default;
  }
  ptr = (char *)0x0;
switchD_00326917_default:
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    InternalMetadata* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg<T>(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t value;                                                         \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
      HANDLE_VARINT_TYPE(BOOL, Bool);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t val;                                                           \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64_t tmp;
        ptr = VarintParse(ptr, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = tmp;

        if (!extension.enum_validity_check.IsValid(value)) {
          WriteVarint(number, value, metadata->mutable_unknown_fields<T>());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32_t tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}